

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hpp
# Opt level: O1

bool ft::
     lexicographical_compare<ft::constTreeIterator<ft::pair<int_const,int>,ft::allocator<ft::treeNode<ft::pair<int_const,int>>>>,ft::constTreeIterator<ft::pair<int_const,int>,ft::allocator<ft::treeNode<ft::pair<int_const,int>>>>,ft::less<ft::pair<int_const,int>>>
               (long first1,long last1,long first2,long last2)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  long lVar8;
  int *piVar9;
  long lVar10;
  bool bVar11;
  
  while( true ) {
    piVar7 = *(int **)(first1 + 0x10);
    if (piVar7 == *(int **)(last1 + 0x10)) {
      return *(long *)(first2 + 0x10) != *(long *)(last2 + 0x10);
    }
    piVar3 = *(int **)(first2 + 0x10);
    if (piVar3 == *(int **)(last2 + 0x10)) {
      return false;
    }
    iVar1 = *piVar3;
    iVar2 = *piVar7;
    if (iVar1 < iVar2) {
      return false;
    }
    if ((iVar1 <= iVar2) && (piVar3[1] < piVar7[1])) break;
    bVar11 = iVar2 < iVar1;
    if (iVar2 == iVar1) {
      bVar11 = piVar7[1] < piVar3[1];
    }
    if (bVar11) {
      return true;
    }
    piVar3 = *(int **)(piVar7 + 6);
    piVar4 = (int *)**(undefined8 **)(first1 + 8);
    if (piVar3 == piVar4) {
      do {
        piVar9 = *(int **)(piVar7 + 8);
        bVar11 = *(int **)(piVar9 + 6) == piVar7;
        piVar7 = piVar9;
      } while (bVar11);
    }
    else {
      *(int **)(first1 + 0x10) = piVar3;
      do {
        piVar9 = piVar3;
        piVar3 = *(int **)(piVar9 + 4);
      } while (*(int **)(piVar9 + 4) != piVar4);
    }
    *(int **)(first1 + 0x10) = piVar9;
    lVar5 = *(long *)(*(long *)(first2 + 0x10) + 0x18);
    lVar6 = **(long **)(first2 + 8);
    lVar10 = *(long *)(first2 + 0x10);
    if (lVar5 == lVar6) {
      do {
        lVar8 = *(long *)(lVar10 + 0x20);
        bVar11 = *(long *)(lVar8 + 0x18) == lVar10;
        lVar10 = lVar8;
      } while (bVar11);
    }
    else {
      *(long *)(first2 + 0x10) = lVar5;
      do {
        lVar8 = lVar5;
        lVar5 = *(long *)(lVar8 + 0x10);
      } while (*(long *)(lVar8 + 0x10) != lVar6);
    }
    *(long *)(first2 + 0x10) = lVar8;
  }
  return false;
}

Assistant:

bool lexicographical_compare(Iterator1 first1, Iterator1 last1, Iterator2 first2, Iterator2 last2, Compare comp,
							 typename ft::_void_t<typename ft::iterator_traits<Iterator1>::iterator_category>::type * = 0,
							 typename ft::_void_t<typename ft::iterator_traits<Iterator2>::iterator_category>::type * = 0) {
	while (first1 != last1) {
		if (first2 == last2 || comp(*first2, *first1)) return false;
		else if (comp(*first1, *first2)) return true;
		++first1; ++first2;
	}
	return first2 != last2;
}